

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdn.c
# Opt level: O2

void Qiniu_Free_CDNFluxRet(Qiniu_CDN_FluxRet *ret)

{
  void *pvVar1;
  Qiniu_CDN_FluxData *addr;
  long lVar2;
  long lVar3;
  
  if (ret->data != (Qiniu_CDN_FluxData *)0x0) {
    lVar2 = 0;
    for (lVar3 = 0; addr = ret->data, lVar3 < ret->domainsCount; lVar3 = lVar3 + 1) {
      pvVar1 = *(void **)((long)&addr->china + lVar2);
      if (pvVar1 != (void *)0x0) {
        Qiniu_Free(pvVar1);
        addr = ret->data;
      }
      pvVar1 = *(void **)((long)&addr->oversea + lVar2);
      if (pvVar1 != (void *)0x0) {
        Qiniu_Free(pvVar1);
      }
      lVar2 = lVar2 + 0x28;
    }
    Qiniu_Free(addr);
    return;
  }
  return;
}

Assistant:

void Qiniu_Free_CDNFluxRet(Qiniu_CDN_FluxRet *ret) {
    int i;

    if (ret->data != NULL) {
        for (i = 0; i < ret->domainsCount; ++i) {
            if (ret->data[i].china != NULL) {
                Qiniu_Free(ret->data[i].china);
            }
            if (ret->data[i].oversea != NULL) {
                Qiniu_Free(ret->data[i].oversea);
            }
        }
        Qiniu_Free(ret->data);
    }
}